

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O0

void give_may_advance_msg(int skill)

{
  char *local_20;
  char *local_18;
  int skill_local;
  
  if (skill == 0) {
    local_18 = "";
  }
  else {
    if (skill < 0x1e) {
      local_20 = "weapon ";
    }
    else {
      local_20 = "fighting ";
      if (skill < 0x25) {
        local_20 = "spell casting ";
      }
    }
    local_18 = local_20;
  }
  pline("You feel more confident in your %sskills.",local_18);
  nomul(0,(char *)0x0);
  return;
}

Assistant:

static void give_may_advance_msg(int skill)
{
	pline("You feel more confident in your %sskills.",
		skill == P_NONE ?
			"" :
		skill <= P_LAST_WEAPON ?
			"weapon " :
		skill <= P_LAST_SPELL ?
			"spell casting " :
		"fighting ");
	nomul(0, NULL);
}